

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::~BufferTestInstance(BufferTestInstance *this)

{
  SparseContext *pSVar1;
  VkDevice pVVar2;
  
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BufferTestInstance_00d1e3b0;
  pSVar1 = (this->m_sparseContext).
           super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
           .m_data.ptr;
  if (pSVar1 != (SparseContext *)0x0) {
    ::vk::DeviceDriver::~DeviceDriver(&pSVar1->m_deviceInterface);
    pVVar2 = (pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    if (pVVar2 != (VkDevice)0x0) {
      (*(pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                (pVVar2,*(VkAllocationCallbacks **)
                         ((long)&(pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter +
                         8));
    }
    (pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
    (pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
         (DestroyDeviceFunc)0x0;
    *(VkAllocationCallbacks **)
     ((long)&(pSVar1->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter + 8) =
         (VkAllocationCallbacks *)0x0;
    operator_delete(pSVar1,0x4d8);
    (this->m_sparseContext).
    super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
    .m_data.ptr = (SparseContext *)0x0;
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

BufferTestInstance			(Context&				ctx,
															 BufferCaseParameters	testCase)
									: TestInstance		(ctx)
									, m_testCase		(testCase)
									, m_sparseContext	(createSparseContext())
								{}